

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int add_var(JSContext *ctx,JSFunctionDef *fd,JSAtom name)

{
  undefined1 *puVar1;
  JSVarDef *pJVar2;
  JSVarDef *pJVar3;
  JSAtomStruct *pJVar4;
  int iVar5;
  
  iVar5 = fd->var_count;
  if (iVar5 < 0x10000) {
    if ((fd->var_size <= iVar5) &&
       (iVar5 = js_realloc_array(ctx,&fd->vars,0x10,&fd->var_size,iVar5 + 1), iVar5 != 0)) {
      return -1;
    }
    iVar5 = fd->var_count;
    fd->var_count = iVar5 + 1;
    pJVar2 = fd->vars + iVar5;
    pJVar3 = fd->vars + iVar5;
    pJVar3->var_name = 0;
    pJVar3->scope_level = 0;
    *(undefined8 *)&pJVar3->scope_next = 0;
    if (0xd1 < (int)name) {
      pJVar4 = ctx->rt->atom_array[name];
      (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
    }
    pJVar2->var_name = name;
    puVar1 = &pJVar2->field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x7fffff80;
    iVar5 = fd->var_count + -1;
  }
  else {
    JS_ThrowInternalError(ctx,"too many local variables");
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int add_var(JSContext *ctx, JSFunctionDef *fd, JSAtom name)
{
    JSVarDef *vd;

    /* the local variable indexes are currently stored on 16 bits */
    if (fd->var_count >= JS_MAX_LOCAL_VARS) {
        JS_ThrowInternalError(ctx, "too many local variables");
        return -1;
    }
    if (js_resize_array(ctx, (void **)&fd->vars, sizeof(fd->vars[0]),
                        &fd->var_size, fd->var_count + 1))
        return -1;
    vd = &fd->vars[fd->var_count++];
    memset(vd, 0, sizeof(*vd));
    vd->var_name = JS_DupAtom(ctx, name);
    vd->func_pool_idx = -1;
    return fd->var_count - 1;
}